

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udp.c
# Opt level: O0

void udp_finish_tx(udp_ep *ep)

{
  ushort uVar1;
  udp_txdesc *puVar2;
  udp_txdesc *desc;
  udp_txring *ring;
  udp_ep *ep_local;
  
  if ((ep->tx_ring).count == 0) {
    nni_panic("%s: %d: assert err: %s",
              "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/transport/udp/udp.c"
              ,0x1f2,"ring->count > 0");
  }
  puVar2 = (ep->tx_ring).descs;
  uVar1 = (ep->tx_ring).tail;
  if ((puVar2[uVar1].submitted & 1U) == 0) {
    nni_panic("%s: %d: assert err: %s",
              "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/transport/udp/udp.c"
              ,500,"desc->submitted");
  }
  if (puVar2[uVar1].payload != (nni_msg *)0x0) {
    nni_msg_free(puVar2[uVar1].payload);
    puVar2[uVar1].payload = (nni_msg *)0x0;
  }
  puVar2[uVar1].submitted = false;
  (ep->tx_ring).tail = (ep->tx_ring).tail + 1;
  (ep->tx_ring).count = (ep->tx_ring).count - 1;
  if ((ep->tx_ring).tail == (ep->tx_ring).size) {
    (ep->tx_ring).tail = 0;
  }
  ep->tx_busy = false;
  udp_start_tx(ep);
  return;
}

Assistant:

static void
udp_finish_tx(udp_ep *ep)
{
	udp_txring *ring = &ep->tx_ring;
	udp_txdesc *desc;

	NNI_ASSERT(ring->count > 0);
	desc = &ring->descs[ring->tail];
	NNI_ASSERT(desc->submitted);
	if (desc->payload != NULL) {
		nni_msg_free(desc->payload);
		desc->payload = NULL;
	}
	desc->submitted = false;
	ring->tail++;
	ring->count--;
	if (ring->tail == ring->size) {
		ring->tail = 0;
	}
	ep->tx_busy = false;

	// possibly start another tx going
	udp_start_tx(ep);
}